

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_extended_test.cc
# Opt level: O0

void run_tests_with_encryption(fdb_encryption_algorithm_t encryption)

{
  uint in_EDI;
  char *in_stack_00000250;
  
  fprintf(_stderr,"----testing with encryption algorithm %d\n",(ulong)in_EDI);
  cur_encryption = in_EDI;
  test_multi_readers(MULTI_READERS,"test multi readers");
  test_multi_readers(MULTI_SNAPSHOT_READERS,"test multi snapshot readers");
  test_multi_readers(MULTI_MIXED_READERS,"test multi mixed readers");
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_READERS,MANUAL_COMPACTION,"test a single writer and multi readers"
            );
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_SNAPSHOT_READERS,MANUAL_COMPACTION,
             "test a single writer and multi snapshot readers");
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_MIXED_READERS,MANUAL_COMPACTION,
             "test a single writer and multi mixed readers");
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_READERS,DAEMON_COMPACTION,
             "test a single writer, a compaction daemon, and multi readers");
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_SNAPSHOT_READERS,DAEMON_COMPACTION,
             "test a single writer, a compaction daemon, and multi snapshot readers");
  test_writer_multi_readers
            (REGULAR_WRITER,MULTI_MIXED_READERS,DAEMON_COMPACTION,
             "test a single writer, a compaction daemon, and multi mixed readers");
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_READERS,MANUAL_COMPACTION,
             "test a transactional writer and multi readers");
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_SNAPSHOT_READERS,MANUAL_COMPACTION,
             "test a transactional writer and multi snapshot readers");
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_MIXED_READERS,MANUAL_COMPACTION,
             "test a transactional writer and multi mixed readers");
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_READERS,DAEMON_COMPACTION,
             "test a transactional writer, a compaction daemon, and multi readers");
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_SNAPSHOT_READERS,DAEMON_COMPACTION,
             "test a transactional writer, a compaction daemon, and multi snapshot readers");
  test_writer_multi_readers
            (TRANSACTIONAL_WRITER,MULTI_MIXED_READERS,DAEMON_COMPACTION,
             "test a transactional writer, a compaction daemon, and multi mixed readers");
  test_rollback_multi_readers(MULTI_READERS,"test a rollback and multi readers");
  test_rollback_multi_readers(MULTI_SNAPSHOT_READERS,"test a rollback and multi snapshot readers");
  test_rollback_multi_readers(MULTI_MIXED_READERS,"test a rollback and multi mixed readers");
  test_rollback_compaction(in_stack_00000250);
  return;
}

Assistant:

void run_tests_with_encryption(fdb_encryption_algorithm_t encryption) {
    fprintf(stderr, "----testing with encryption algorithm %d\n", encryption);
    cur_encryption = encryption;

    // Read-only with multiple readers.
    test_multi_readers(MULTI_READERS, "test multi readers");
    test_multi_readers(MULTI_SNAPSHOT_READERS, "test multi snapshot readers");
    test_multi_readers(MULTI_MIXED_READERS, "test multi mixed readers");

    // Execute a writer with a manual compaction and multiple readers together.
    test_writer_multi_readers(REGULAR_WRITER, MULTI_READERS, MANUAL_COMPACTION,
                              "test a single writer and multi readers");
    test_writer_multi_readers(REGULAR_WRITER, MULTI_SNAPSHOT_READERS,
                              MANUAL_COMPACTION,
                              "test a single writer and multi snapshot readers");
    test_writer_multi_readers(REGULAR_WRITER, MULTI_MIXED_READERS,
                              MANUAL_COMPACTION,
                              "test a single writer and multi mixed readers");

    // Execute a writer, a compaction daemon, and multiple readers together.
    test_writer_multi_readers(REGULAR_WRITER, MULTI_READERS, DAEMON_COMPACTION,
                              "test a single writer, a compaction daemon, "
                              "and multi readers");
    test_writer_multi_readers(REGULAR_WRITER, MULTI_SNAPSHOT_READERS,
                              DAEMON_COMPACTION,
                              "test a single writer, a compaction daemon, "
                              "and multi snapshot readers");
    test_writer_multi_readers(REGULAR_WRITER, MULTI_MIXED_READERS,
                              DAEMON_COMPACTION,
                              "test a single writer, a compaction daemon, "
                              "and multi mixed readers");

    // Execute a transactional writer with a manual compaction and
    // multiple readers together.
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_READERS,
                              MANUAL_COMPACTION,
                              "test a transactional writer and "
                              "multi readers");
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_SNAPSHOT_READERS,
                              MANUAL_COMPACTION,
                              "test a transactional writer and "
                              "multi snapshot readers");
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_MIXED_READERS,
                              MANUAL_COMPACTION,
                              "test a transactional writer and "
                              "multi mixed readers");

    // Execute a transactional writer, a compaction daemon, and
    // multiple readers together.
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_READERS,
                              DAEMON_COMPACTION,
                              "test a transactional writer, a compaction daemon, "
                              "and multi readers");
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_SNAPSHOT_READERS,
                              DAEMON_COMPACTION,
                              "test a transactional writer, a compaction daemon, "
                              "and multi snapshot readers");
    test_writer_multi_readers(TRANSACTIONAL_WRITER, MULTI_MIXED_READERS,
                              DAEMON_COMPACTION,
                              "test a transactional writer, a compaction daemon, "
                              "and multi mixed readers");

    // Execute a rollback and multiple readers together.
    test_rollback_multi_readers(MULTI_READERS, "test a rollback and multi readers");
    test_rollback_multi_readers(MULTI_SNAPSHOT_READERS,
                                "test a rollback and multi snapshot readers");
    test_rollback_multi_readers(MULTI_MIXED_READERS,
                                "test a rollback and multi mixed readers");
    test_rollback_compaction("test concurrent rollback and compaction");
}